

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

bool Js::JavascriptLibrary::InitializeWebAssemblyTableConstructor
               (DynamicObject *constructor,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *pJVar1;
  undefined8 in_RAX;
  uint uVar3;
  StaticType *type;
  LiteralString *pLVar2;
  ulong uVar4;
  
  uVar3 = (uint)((ulong)in_RAX >> 0x20);
  DeferredTypeHandlerBase::Convert(typeHandler,constructor,mode,3,0);
  pJVar1 = (((constructor->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  uVar4 = (ulong)uVar3 << 0x20;
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0xd1,&DAT_1000000000001,2,0,0,uVar4);
  uVar4 = uVar4 & 0xffffffff00000000;
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])
            (constructor,0x124,(pJVar1->webAssemblyTablePrototype).ptr,0,0,0,uVar4);
  type = StringCache::GetStringTypeStatic(&pJVar1->stringCache);
  pLVar2 = LiteralString::New(type,L"Table",5,pJVar1->recycler);
  (*(constructor->super_RecyclableObject).super_FinalizableObject.super_IRecyclerVisitedObject.
    _vptr_IRecyclerVisitedObject[0x1e])(constructor,0x106,pLVar2,2,0,0,uVar4 & 0xffffffff00000000);
  DynamicObject::SetHasNoEnumerableProperties(constructor,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeWebAssemblyTableConstructor(DynamicObject* constructor, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(constructor, mode, 3);
        JavascriptLibrary* library = constructor->GetLibrary();

        library->AddMember(constructor, PropertyIds::length, TaggedInt::ToVarUnchecked(1), PropertyConfigurable);
        library->AddMember(constructor, PropertyIds::prototype, library->webAssemblyTablePrototype, PropertyNone);
        library->AddMember(constructor, PropertyIds::name, library->CreateStringFromCppLiteral(_u("Table")), PropertyConfigurable);

        constructor->SetHasNoEnumerableProperties(true);

        return true;
    }